

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_CallFlowGraph.h
# Opt level: O2

void soul::CallFlowGraph::iterateCallSequences
               (Function *f,CallSequenceCheckResults *results,PreviousCall *previous,
               uint64_t stackSize)

{
  bool bVar1;
  ulong uVar2;
  Statement *object;
  FunctionCall *pFVar3;
  Function *f_00;
  pool_ref<soul::heart::Block> *b;
  pointer ppVar4;
  ulong stackSize_00;
  Iterator __begin3;
  pool_ptr<soul::heart::FunctionCall> call;
  PreviousCall newPrevious;
  Iterator local_58;
  pointer local_50;
  long local_48;
  PreviousCall local_40;
  
  calculateLocalVariableStackSize(f);
  stackSize_00 = stackSize + f->localVariableStackSize + 0x10;
  uVar2 = results->maximumStackSize;
  if (results->maximumStackSize <= stackSize_00) {
    uVar2 = stackSize_00;
  }
  results->maximumStackSize = uVar2;
  local_40.previous = previous;
  local_40.function = f;
  if ((previous != (PreviousCall *)0x0) && (bVar1 = PreviousCall::contains(previous,f), bVar1)) {
    if ((results->recursiveFunctionCallSequence).
        super__Vector_base<soul::pool_ref<soul::heart::Function>,_std::allocator<soul::pool_ref<soul::heart::Function>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (results->recursiveFunctionCallSequence).
        super__Vector_base<soul::pool_ref<soul::heart::Function>,_std::allocator<soul::pool_ref<soul::heart::Function>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    PreviousCall::findCallSequenceUpTo(previous,f,&results->recursiveFunctionCallSequence);
    return;
  }
  local_50 = (f->blocks).
             super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar4 = (f->blocks).
                super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar4 != local_50; ppVar4 = ppVar4 + 1)
  {
    local_58.object = (ppVar4->object->statements).firstObject;
    while (local_58.object != (Statement *)0x0) {
      object = LinkedList<soul::heart::Statement>::Iterator::operator*(&local_58);
      cast<soul::heart::FunctionCall,soul::heart::Statement>((soul *)&local_48,object);
      if (local_48 != 0) {
        pFVar3 = pool_ptr<soul::heart::FunctionCall>::operator->
                           ((pool_ptr<soul::heart::FunctionCall> *)&local_48);
        f_00 = pool_ptr<soul::heart::Function>::operator*(&pFVar3->function);
        iterateCallSequences(f_00,results,&local_40,stackSize_00);
      }
      LinkedList<soul::heart::Statement>::Iterator::operator++(&local_58);
    }
  }
  return;
}

Assistant:

static void iterateCallSequences (heart::Function& f,
                                      CallSequenceCheckResults& results,
                                      PreviousCall* previous,
                                      uint64_t stackSize)
    {
        calculateLocalVariableStackSize (f);
        stackSize += perCallStackOverhead + f.localVariableStackSize;
        results.maximumStackSize = std::max (results.maximumStackSize, stackSize);

        PreviousCall newPrevious { previous, f };

        if (previous != nullptr && previous->contains (f))
        {
            if (results.recursiveFunctionCallSequence.empty())
                previous->findCallSequenceUpTo (f, results.recursiveFunctionCallSequence);

            return;
        }

        for (auto& b : f.blocks)
            for (auto s : b->statements)
                if (auto call = cast<heart::FunctionCall> (*s))
                    iterateCallSequences (call->getFunction(), results, std::addressof (newPrevious), stackSize);
    }